

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_SetWeapon(FParser *this)

{
  AActor *this_00;
  PClass *pPVar1;
  uint uVar2;
  int iVar3;
  char *name;
  PClassActor *type;
  AWeapon *this_01;
  undefined4 extraout_var;
  PClass *pPVar4;
  long lVar5;
  AWeapon *weap;
  bool bVar6;
  
  if (this->t_argc < 2) {
    script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
    return;
  }
  uVar2 = T_GetPlayerNum(this->t_argv);
  if (uVar2 != 0xffffffff) {
    lVar5 = (ulong)uVar2 * 0x2a0;
    this_00 = (AActor *)(&players)[(ulong)uVar2 * 0x54];
    name = stringvalue(this->t_argv + 1);
    type = PClass::FindActor(name);
    this_01 = (AWeapon *)AActor::FindInventory(this_00,type,false);
    pPVar1 = AWeapon::RegistrationInfo.MyClass;
    if (this_01 != (AWeapon *)0x0) {
      if ((this_01->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject
          .Class == (PClass *)0x0) {
        iVar3 = (**(this_01->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                   super_DObject._vptr_DObject)(this_01);
        (this_01->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
        Class = (PClass *)CONCAT44(extraout_var,iVar3);
      }
      pPVar4 = (this_01->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
               super_DObject.Class;
      bVar6 = pPVar4 != (PClass *)0x0;
      if (pPVar4 != pPVar1 && bVar6) {
        do {
          pPVar4 = pPVar4->ParentClass;
          bVar6 = pPVar4 != (PClass *)0x0;
          if (pPVar4 == pPVar1) break;
        } while (pPVar4 != (PClass *)0x0);
      }
      if (bVar6) {
        if (*(AWeapon **)(&DAT_017e5f20 + lVar5) == this_01) {
          *(PClass **)(&DAT_017e5f28 + lVar5) = AWeapon::RegistrationInfo.MyClass;
          (this->t_return).value.i = 1;
        }
        else {
          bVar6 = AWeapon::CheckAmmo(this_01,2,false,false,-1);
          if (bVar6) {
            (this->t_return).value.i = 1;
            *(AWeapon **)(&DAT_017e5f28 + lVar5) = this_01;
          }
        }
      }
    }
  }
  (this->t_return).value.i = 0;
  return;
}

Assistant:

void FParser::SF_SetWeapon()
{
	if (CheckArgs(2))
	{
		int playernum=T_GetPlayerNum(t_argv[0]);
		if (playernum!=-1) 
		{
			AInventory *item = players[playernum].mo->FindInventory (PClass::FindActor (stringvalue(t_argv[1])));

			if (item == NULL || !item->IsKindOf (RUNTIME_CLASS(AWeapon)))
			{
			}
			else if (players[playernum].ReadyWeapon == item)
			{
				// The weapon is already selected, so setweapon succeeds by default,
				// but make sure the player isn't switching away from it.
				players[playernum].PendingWeapon = WP_NOCHANGE;
				t_return.value.i = 1;
			}
			else
			{
				AWeapon *weap = static_cast<AWeapon *> (item);

				if (weap->CheckAmmo (AWeapon::EitherFire, false))
				{
					// There's enough ammo, so switch to it.
					t_return.value.i = 1;
					players[playernum].PendingWeapon = weap;
				}
			}
		}
		t_return.value.i = 0;
	}
}